

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::FboCases::SharedColorbufferTest::render
          (SharedColorbufferTest *this,Context *context,Surface *dst)

{
  GLenum GVar1;
  GLenum GVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  _func_int **pp_Var6;
  int in_R9D;
  ulong uVar7;
  FboConfig *config;
  Vec3 local_378;
  undefined4 uStack_36c;
  Framebuffer fboA;
  Framebuffer fboB;
  Vec3 local_308;
  FboConfig cfg;
  FlatColorShader flatShader;
  SingleTex2DShader shader;
  
  SingleTex2DShader::SingleTex2DShader(&shader);
  uVar3 = (*context->_vptr_Context[0x75])(context,&shader);
  GVar1 = (this->super_FboRenderCase).m_config.stencilbufferFormat;
  createQuadsTex2D(context,1,0x1907,0x40,0x40,in_R9D);
  createMetaballsTex2D(context,2,0x1908,0x40,0x40,in_R9D);
  (*context->_vptr_Context[5])(context,0,0,0x80,0x80);
  (*context->_vptr_Context[0x76])(context,(ulong)uVar3);
  uVar4 = (*context->_vptr_Context[0x66])(context,(ulong)uVar3,"u_sampler0");
  (*context->_vptr_Context[0x5b])(context,(ulong)uVar4,0);
  config = &(this->super_FboRenderCase).m_config;
  Functional::Framebuffer::Framebuffer(&fboA,context,config,0x80,0x80,0,0,0,0);
  Functional::Framebuffer::checkCompleteness(&fboA);
  cfg.depthbufferType = (this->super_FboRenderCase).m_config.depthbufferType;
  cfg.depthbufferFormat = (this->super_FboRenderCase).m_config.depthbufferFormat;
  cfg.stencilbufferType = (this->super_FboRenderCase).m_config.stencilbufferType;
  cfg.stencilbufferFormat = (this->super_FboRenderCase).m_config.stencilbufferFormat;
  cfg.colorbufferType = 0;
  cfg.colorbufferFormat = 0;
  Functional::Framebuffer::Framebuffer(&fboB,context,&cfg,0x80,0x80,0,0,0,0);
  (*context->_vptr_Context[9])(context,0x8d40,(ulong)fboB.m_framebuffer);
  GVar2 = config->colorbufferType;
  if (GVar2 == 0xde1) {
    (*context->_vptr_Context[0x1e])(context,0x8d40,0x8ce0,0xde1,(ulong)fboA.m_colorbuffer,0);
  }
  else if (GVar2 == 0x8d41) {
    (*context->_vptr_Context[0x20])(context,0x8d40,0x8ce0,0x8d41,(ulong)fboA.m_colorbuffer);
  }
  (*context->_vptr_Context[0x2d])(context,0x500);
  (*context->_vptr_Context[9])(context,0x8d40,(ulong)fboA.m_framebuffer);
  (*context->_vptr_Context[6])(context,0xde1,1);
  (*context->_vptr_Context[0x2a])(0,0,0,0x3f800000,context);
  (*context->_vptr_Context[0x2d])(context,0x4500);
  if (GVar1 != 0) {
    (*context->_vptr_Context[0x2c])(context,1);
    (*context->_vptr_Context[0x2d])(context,0x400);
  }
  (*context->_vptr_Context[0x33])(context,0xb71);
  flatShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader =
       (_func_int **)0xbf800000bf800000;
  flatShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  local_378.m_data[0] = 1.0;
  local_378.m_data[1] = 1.0;
  local_378.m_data[2] = 0.0;
  sglr::drawQuad(context,uVar3,(Vec3 *)&flatShader,&local_378);
  (*context->_vptr_Context[0x34])(context,0xb71);
  (*context->_vptr_Context[9])(context,0x8d40,(ulong)fboB.m_framebuffer);
  (*context->_vptr_Context[6])(context,0xde1,2);
  (*context->_vptr_Context[0x33])(context,0xbe2);
  (*context->_vptr_Context[0x42])(context,0x302,0x303,0,1);
  flatShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader =
       (_func_int **)0xbf800000bf800000;
  flatShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  local_378.m_data[0] = 1.0;
  local_378.m_data[1] = 1.0;
  local_378.m_data[2] = 0.0;
  sglr::drawQuad(context,uVar3,(Vec3 *)&flatShader,&local_378);
  (*context->_vptr_Context[6])(context,0xde1,1);
  (*context->_vptr_Context[0x33])(context,0xb71);
  flatShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader =
       (_func_int **)&DAT_3f0000003f000000;
  flatShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x3f000000;
  local_378.m_data[0] = 1.0;
  local_378.m_data[1] = 1.0;
  local_378.m_data[2] = 0.5;
  sglr::drawQuad(context,uVar3,(Vec3 *)&flatShader,&local_378);
  (*context->_vptr_Context[0x34])(context,0xb71);
  if (GVar1 != 0) {
    FlatColorShader::FlatColorShader(&flatShader);
    uVar4 = (*context->_vptr_Context[0x75])(context,&flatShader);
    local_378.m_data[0] = 0.0;
    local_378.m_data[1] = 1.0;
    local_378.m_data[2] = 0.0;
    uStack_36c = 0x3f800000;
    (*context->_vptr_Context[0x76])(context,(ulong)uVar4);
    uVar5 = (*context->_vptr_Context[0x66])(context,(ulong)uVar4,"u_color");
    (*context->_vptr_Context[0x5f])(context,(ulong)uVar5,1,&local_378);
    (*context->_vptr_Context[0x33])(context,0xc11);
    (*context->_vptr_Context[0x32])(context,10,10,0xc,0x19);
    (*context->_vptr_Context[0x2c])(context,1);
    (*context->_vptr_Context[0x2d])(context,0x400);
    (*context->_vptr_Context[0x34])(context,0xc11);
    (*context->_vptr_Context[0x33])(context,0xb90);
    (*context->_vptr_Context[0x35])(context,0x202,1,0xff);
    local_378.m_data[0] = -1.0;
    local_378.m_data[1] = -1.0;
    local_378.m_data[2] = 0.0;
    local_308.m_data[0] = 1.0;
    local_308.m_data[1] = 1.0;
    local_308.m_data[2] = 0.0;
    sglr::drawQuad(context,uVar4,&local_378,&local_308);
    (*context->_vptr_Context[0x34])(context,0xb90);
    sglr::ShaderProgram::~ShaderProgram(&flatShader.super_ShaderProgram);
  }
  pp_Var6 = context->_vptr_Context;
  uVar4 = 0x80;
  if (fboA.m_config.colorbufferType == 0xde1) {
    (*pp_Var6[9])(context,0x8d40,0);
    (*context->_vptr_Context[6])(context,0xde1,(ulong)fboA.m_colorbuffer);
    uVar4 = (*context->_vptr_Context[2])(context);
    uVar5 = (*context->_vptr_Context[3])(context);
    (*context->_vptr_Context[5])(context,0,0,(ulong)uVar4,(ulong)uVar5);
    flatShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader =
         (_func_int **)0xbf800000bf800000;
    flatShader.super_ShaderProgram.super_VertexShader.m_inputs.
    super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0;
    local_378.m_data[0] = 1.0;
    local_378.m_data[1] = 1.0;
    local_378.m_data[2] = 0.0;
    sglr::drawQuad(context,uVar3,(Vec3 *)&flatShader,&local_378);
    uVar4 = (*context->_vptr_Context[2])(context);
    uVar3 = (*context->_vptr_Context[3])(context);
    uVar7 = (ulong)uVar3;
    pp_Var6 = context->_vptr_Context;
  }
  else {
    uVar7 = 0x80;
  }
  (*pp_Var6[0x80])(context,dst,0,0,(ulong)uVar4,uVar7);
  Functional::Framebuffer::~Framebuffer(&fboB);
  Functional::Framebuffer::~Framebuffer(&fboA);
  sglr::ShaderProgram::~ShaderProgram(&shader.super_ShaderProgram);
  return;
}

Assistant:

void SharedColorbufferTest::render (sglr::Context& context, Surface& dst)
{
	SingleTex2DShader	shader;
	deUint32			shaderID		= context.createProgram(&shader);
	int					width			= 128;
	int					height			= 128;
//	bool				depth			= getConfig().depthbufferFormat		!= GL_NONE;
	bool				stencil			= getConfig().stencilbufferFormat	!= GL_NONE;

	// Textures
	deUint32	quadsTex		= 1;
	deUint32	metaballsTex	= 2;
	createQuadsTex2D(context, quadsTex, GL_RGB, GL_UNSIGNED_BYTE, 64, 64);
	createMetaballsTex2D(context, metaballsTex, GL_RGBA, GL_UNSIGNED_BYTE, 64, 64);

	context.viewport(0, 0, width, height);

	shader.setUnit(context, shaderID, 0);

	// Fbo A
	Framebuffer fboA(context, getConfig(), width, height);
	fboA.checkCompleteness();

	// Fbo B - don't create colorbuffer
	FboConfig cfg = getConfig();
	cfg.colorbufferType		= GL_NONE;
	cfg.colorbufferFormat	= GL_NONE;
	Framebuffer fboB(context, cfg, width, height);

	// Attach color buffer from fbo A
	context.bindFramebuffer(GL_FRAMEBUFFER, fboB.getFramebuffer());
	switch (getConfig().colorbufferType)
	{
		case GL_TEXTURE_2D:
			context.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, fboA.getColorbuffer(), 0);
			break;

		case GL_RENDERBUFFER:
			context.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, fboA.getColorbuffer());
			break;

		default:
			DE_ASSERT(false);
	}

	// Clear depth and stencil in fbo B
	context.clear(GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

	// Render quads to fbo 1, with depth 0.0
	context.bindFramebuffer(GL_FRAMEBUFFER, fboA.getFramebuffer());
	context.bindTexture(GL_TEXTURE_2D, quadsTex);
	context.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	context.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

	if (stencil)
	{
		// Stencil to 1 in fbo A
		context.clearStencil(1);
		context.clear(GL_STENCIL_BUFFER_BIT);
	}

	context.enable(GL_DEPTH_TEST);
	sglr::drawQuad(context, shaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
	context.disable(GL_DEPTH_TEST);

	// Blend metaballs to fbo 2
	context.bindFramebuffer(GL_FRAMEBUFFER, fboB.getFramebuffer());
	context.bindTexture(GL_TEXTURE_2D, metaballsTex);
	context.enable(GL_BLEND);
	context.blendFuncSeparate(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA, GL_ZERO, GL_ONE);
	sglr::drawQuad(context, shaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

	// Render small quad that is only visible if depth buffer is not shared with fbo A - or there is no depth bits
	context.bindTexture(GL_TEXTURE_2D, quadsTex);
	context.enable(GL_DEPTH_TEST);
	sglr::drawQuad(context, shaderID, Vec3(0.5f, 0.5f, 0.5f), Vec3(1.0f, 1.0f, 0.5f));
	context.disable(GL_DEPTH_TEST);

	if (stencil)
	{
		FlatColorShader flatShader;
		deUint32		flatShaderID = context.createProgram(&flatShader);

		flatShader.setColor(context, flatShaderID, Vec4(0.0f, 1.0f, 0.0f, 1.0f));

		// Clear subset of stencil buffer to 1
		context.enable(GL_SCISSOR_TEST);
		context.scissor(10, 10, 12, 25);
		context.clearStencil(1);
		context.clear(GL_STENCIL_BUFFER_BIT);
		context.disable(GL_SCISSOR_TEST);

		// Render quad with stencil mask == 1
		context.enable(GL_STENCIL_TEST);
		context.stencilFunc(GL_EQUAL, 1, 0xffu);
		sglr::drawQuad(context, flatShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
		context.disable(GL_STENCIL_TEST);
	}

	// Get results
	if (fboA.getConfig().colorbufferType == GL_TEXTURE_2D)
	{
		context.bindFramebuffer(GL_FRAMEBUFFER, 0);
		context.bindTexture(GL_TEXTURE_2D, fboA.getColorbuffer());
		context.viewport(0, 0, context.getWidth(), context.getHeight());
		sglr::drawQuad(context, shaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
		context.readPixels(dst, 0, 0, context.getWidth(), context.getHeight());
	}
	else
		context.readPixels(dst, 0, 0, width, height);
}